

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

void __thiscall BufferedReader::thread_main(BufferedReader *this)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ReaderData *pRVar6;
  lock_guard<std::mutex> lock;
  pthread_mutex_t *__mutex;
  FileNameIterator *pFVar7;
  lock_guard<std::mutex> lk;
  int readerID;
  string nextFileName;
  int local_6c;
  condition_variable *local_68;
  pthread_mutex_t *local_60;
  map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = &this->m_readCond;
  __mutex = (pthread_mutex_t *)&this->m_readersMtx;
  local_58 = &this->m_readers;
  local_60 = __mutex;
  do {
    do {
      if ((this->m_terminated != false) ||
         (local_6c = WaitableSafeQueue<int>::pop(&this->m_readQueue), this->m_terminated == true)) {
        return;
      }
      pRVar6 = getReader(this,local_6c);
    } while (pRVar6 == (ReaderData *)0x0);
    if (pRVar6->m_deleted == false) {
      iVar5 = pRVar6->m_readOffset;
      puVar1 = pRVar6->m_nextBlock[pRVar6->m_bufferIndex];
      iVar3 = (*pRVar6->_vptr_ReaderData[5])(pRVar6,puVar1 + iVar5,(ulong)pRVar6->m_blockSize);
      if (pRVar6->m_lastBlock == true) {
        pRVar6->m_firstBlock = true;
        pRVar6->m_lastBlock = false;
      }
      else if (pRVar6->m_firstBlock == true) {
        pRVar6->m_firstBlock = false;
      }
      if (iVar3 < 1) {
        pFVar7 = pRVar6->itr;
        if (pFVar7 != (FileNameIterator *)0x0) goto LAB_00193fc5;
        pRVar6->m_eof = true;
LAB_0019403c:
        pRVar6->m_blockSize = (this->super_AbstractReader).m_blockSize;
        if (iVar3 == 0) {
          pRVar6->m_eof = true;
          iVar3 = 0;
        }
      }
      else {
        if ((iVar3 < (int)pRVar6->m_blockSize) &&
           (pFVar7 = pRVar6->itr, pFVar7 != (FileNameIterator *)0x0)) {
LAB_00193fc5:
          (**pFVar7->_vptr_FileNameIterator)(&local_50);
          bVar2 = std::operator!=(&local_50,&pRVar6->m_streamName);
          if (bVar2) {
            (*pRVar6->_vptr_ReaderData[6])(pRVar6);
            std::__cxx11::string::_M_assign((string *)&pRVar6->m_streamName);
            if (((pRVar6->m_streamName)._M_string_length == 0) ||
               (iVar4 = (*pRVar6->_vptr_ReaderData[4])(pRVar6), (char)iVar4 == '\0')) {
              pRVar6->m_eof = true;
            }
            else if (iVar3 == 0) {
              pRVar6->m_firstBlock = true;
              iVar3 = (*pRVar6->_vptr_ReaderData[5])
                                (pRVar6,puVar1 + iVar5,
                                 (ulong)(this->super_AbstractReader).m_blockSize);
              if (iVar3 < (int)(this->super_AbstractReader).m_blockSize) {
                pRVar6->m_lastBlock = true;
                pRVar6->m_eof = true;
              }
            }
            else {
              pRVar6->m_lastBlock = true;
            }
          }
          std::__cxx11::string::~string((string *)&local_50);
          goto LAB_0019403c;
        }
        pRVar6->m_blockSize = (this->super_AbstractReader).m_blockSize;
      }
      std::mutex::lock(&this->m_readMtx);
      pRVar6->m_nextBlockSize = iVar3;
      std::condition_variable::notify_one();
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_readMtx);
      __mutex = local_60;
    }
    std::mutex::lock((mutex *)&__mutex->__data);
    iVar5 = pRVar6->m_atQueue + -1;
    pRVar6->m_atQueue = iVar5;
    if ((iVar5 == 0 & pRVar6->m_deleted) == 1) {
      (*pRVar6->_vptr_ReaderData[1])(pRVar6);
      std::
      _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
      ::erase(&local_58->_M_t,&local_6c);
    }
    pthread_mutex_unlock(__mutex);
  } while( true );
}

Assistant:

void BufferedReader::thread_main()
{
    try
    {
        while (!m_terminated)
        {
            const int readerID = m_readQueue.pop();
            if (m_terminated)
            {
                break;
            }
            ReaderData* data = getReader(readerID);
            if (data)
            {
                uint8_t* buffer = data->m_nextBlock[data->m_bufferIndex] + data->m_readOffset;
                if (!data->m_deleted)
                {
                    int bytesReaded = data->readBlock(buffer, data->m_blockSize);
                    if (data->m_lastBlock)
                    {
                        data->m_lastBlock = false;
                        data->m_firstBlock = true;
                    }
                    else if (data->m_firstBlock)
                    {
                        data->m_firstBlock = false;
                    }

                    if (bytesReaded <= 0 || (bytesReaded < static_cast<int>(data->m_blockSize) && data->itr))
                    {
                        if (data->itr)
                        {
                            std::string nextFileName = data->itr->getNextName();
                            if (nextFileName != data->m_streamName)
                            {
                                data->closeStream();
                                data->m_streamName = nextFileName;
                                if (!data->m_streamName.empty() && data->openStream())
                                {
                                    if (bytesReaded == 0)
                                    {
                                        // data->m_nextFileInfo = NEXT_FILE_FIRST_BLOCK;
                                        data->m_firstBlock = true;
                                        bytesReaded = data->readBlock(buffer, m_blockSize);
                                        if (bytesReaded < static_cast<int>(m_blockSize))
                                        {
                                            data->m_eof = true;
                                            data->m_lastBlock = true;
                                        }
                                    }
                                    else
                                    {
                                        data->m_lastBlock = true;
                                    }
                                }
                                else
                                    data->m_eof = true;
                            }
                        }
                        else
                        {
                            data->m_eof = true;
                        }
                    }

                    data->m_blockSize = m_blockSize;
                    if (bytesReaded == 0)
                    {
                        data->m_eof = true;
                    }

                    {
                        std::lock_guard lk(m_readMtx);
                        data->m_nextBlockSize = bytesReaded;
                        m_readCond.notify_one();
                    }
                }

                {
                    std::lock_guard lock(m_readersMtx);
                    data->m_atQueue--;
                    if (data->m_deleted && data->m_atQueue == 0)
                    {
                        delete data;
                        m_readers.erase(readerID);
                    }
                }
            }
        }
    }
    catch (std::exception& e)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws exception: " << e.what());
    }
    catch (...)
    {
        LTRACE(LT_ERROR, 0, "BufferedReader::thread_main() throws unknown exception");
    }
}